

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

float ImGui::ScaleRatioFromValueT<long_long,long_long,double>
                (ImGuiDataType data_type,longlong v,longlong v_min,longlong v_max,
                bool is_logarithmic,float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  bool bVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  ulong uVar8;
  longlong lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar17;
  undefined1 in_register_00001204 [60];
  undefined1 auVar20 [64];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  double dVar28;
  undefined4 in_XMM8_Db;
  undefined8 in_XMM8_Qb;
  undefined1 auVar15 [16];
  
  auVar20._4_60_ = in_register_00001204;
  auVar20._0_4_ = logarithmic_zero_epsilon;
  fVar21 = 0.0;
  lVar7 = v_max - v_min;
  if (lVar7 != 0) {
    lVar9 = v_max;
    if (lVar7 != 0 && v_min <= v_max) {
      lVar9 = v_min;
    }
    lVar11 = v_max;
    if (v_max < v_min) {
      lVar11 = v_min;
    }
    if (v < lVar11) {
      lVar11 = v;
    }
    if (v < lVar9) {
      lVar11 = lVar9;
    }
    if (is_logarithmic) {
      uVar8 = v_min;
      if (v_max < v_min) {
        uVar8 = v_max;
      }
      uVar10 = v_min;
      if (v_min < v_max) {
        uVar10 = v_max;
      }
      dVar28 = (double)logarithmic_zero_epsilon;
      auVar22._4_4_ = logarithmic_zero_epsilon;
      auVar22._0_4_ = logarithmic_zero_epsilon;
      auVar22._8_4_ = logarithmic_zero_epsilon;
      auVar22._12_4_ = logarithmic_zero_epsilon;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar8;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar10;
      auVar15 = vpunpcklqdq_avx(auVar24,auVar13);
      auVar13 = vcvtqq2pd_avx512vl(auVar15);
      auVar14._8_4_ = 0xffffffff;
      auVar14._0_8_ = 0x7fffffffffffffff;
      auVar14._12_4_ = 0x7fffffff;
      auVar14 = vandpd_avx512vl(auVar13,auVar14);
      auVar26._8_8_ = dVar28;
      auVar26._0_8_ = dVar28;
      uVar2 = vcmppd_avx512vl(auVar14,auVar26,1);
      uVar12 = vpmovq2m_avx512vl(auVar15);
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      auVar15 = vxorps_avx512vl(auVar22,auVar3);
      bVar1 = (bool)((byte)uVar12 & 1);
      auVar16._0_4_ = (uint)bVar1 * auVar15._0_4_ | (uint)!bVar1 * (int)logarithmic_zero_epsilon;
      bVar1 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar16._4_4_ = (uint)bVar1 * auVar15._4_4_ | (uint)!bVar1 * (int)logarithmic_zero_epsilon;
      bVar1 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar16._8_4_ = (uint)bVar1 * auVar15._8_4_ | (uint)!bVar1 * (int)logarithmic_zero_epsilon;
      bVar1 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar16._12_4_ = (uint)bVar1 * auVar15._12_4_ | (uint)!bVar1 * (int)logarithmic_zero_epsilon;
      auVar14 = vcvtps2pd_avx512vl(auVar16);
      bVar1 = (bool)((byte)(uVar2 & 3) & 1);
      auVar15._0_8_ = (double)((ulong)bVar1 * auVar14._0_8_ | (ulong)!bVar1 * auVar13._0_8_);
      uVar2 = (uVar2 & 3) >> 1;
      auVar15._8_8_ = uVar2 * auVar14._8_8_ | (ulong)!SUB81(uVar2,0) * auVar13._8_8_;
      if ((long)uVar10 < 0 && uVar8 == 0) {
        auVar4._8_4_ = 0x80000000;
        auVar4._0_8_ = 0x8000000080000000;
        auVar4._12_4_ = 0x80000000;
        auVar14 = vxorps_avx512vl(auVar20._0_16_,auVar4);
        auVar18._0_8_ = (double)auVar14._0_4_;
        auVar18._8_8_ = auVar14._8_8_;
        auVar15 = vmovlhps_avx(auVar15,auVar18);
      }
      else if ((long)uVar8 < 0 && uVar10 == 0) {
        auVar6._8_4_ = 0x80000000;
        auVar6._0_8_ = 0x8000000080000000;
        auVar6._12_4_ = 0x80000000;
        auVar14 = vxorps_avx512vl(auVar20._0_16_,auVar6);
        auVar15._0_8_ = (double)auVar14._0_4_;
      }
      dVar17 = (double)lVar11;
      auVar14 = vshufpd_avx(auVar15,auVar15,1);
      fVar21 = 0.0;
      dVar25 = auVar14._0_8_;
      if (dVar25 < dVar17) {
        dVar27 = auVar15._0_8_;
        if (dVar27 <= dVar17) {
          fVar21 = 1.0;
        }
        else if (v_max * v_min < 0) {
          auVar23._0_4_ = (float)(long)uVar8;
          auVar23._8_8_ = in_XMM8_Qb;
          auVar23._4_4_ = in_XMM8_Db;
          auVar5._8_4_ = 0x80000000;
          auVar5._0_8_ = 0x8000000080000000;
          auVar5._12_4_ = 0x80000000;
          auVar15 = vxorps_avx512vl(auVar23,auVar5);
          fVar21 = auVar15._0_4_ / ((float)(long)uVar10 - auVar23._0_4_);
          if (v != 0) {
            if (v < 0) {
              dVar17 = log(-dVar17 / dVar28);
              dVar28 = log(-dVar25 / dVar28);
              fVar21 = (1.0 - (float)(dVar17 / dVar28)) * (fVar21 - zero_deadzone_halfsize);
            }
            else {
              dVar17 = log(dVar17 / dVar28);
              dVar28 = log(dVar27 / dVar28);
              auVar19._0_4_ = (float)(dVar17 / dVar28);
              auVar19._4_4_ = (int)((ulong)(dVar17 / dVar28) >> 0x20);
              auVar19._8_8_ = 0;
              auVar15 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - (fVar21 + zero_deadzone_halfsize))),
                                        auVar19,ZEXT416((uint)(fVar21 + zero_deadzone_halfsize)));
              fVar21 = auVar15._0_4_;
            }
          }
        }
        else if ((v_max | v_min) < 0) {
          dVar28 = log(dVar17 / dVar27);
          dVar17 = log(dVar25 / dVar27);
          fVar21 = 1.0 - (float)(dVar28 / dVar17);
        }
        else {
          dVar28 = log(dVar17 / dVar25);
          dVar17 = log(dVar27 / dVar25);
          fVar21 = (float)(dVar28 / dVar17);
        }
      }
      fVar21 = (float)((uint)(v_max < v_min) * (int)(1.0 - fVar21) +
                      (uint)(v_max >= v_min) * (int)fVar21);
    }
    else {
      fVar21 = (float)((double)(lVar11 - v_min) / (double)lVar7);
    }
  }
  return fVar21;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}